

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

double __thiscall FIX::DoubleField::getValue(DoubleField *this)

{
  double dVar1;
  
  dVar1 = DoubleConvertor::convert(&(this->super_FieldBase).m_string);
  return dVar1;
}

Assistant:

double getValue() const EXCEPT ( IncorrectDataFormat )
    { try
      { return DoubleConvertor::convert( getString() ); }
      catch( FieldConvertError& )
      { throw IncorrectDataFormat( getTag(), getString() ); } }